

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::Program::disableAttributeArray
          (Program *this,VarSpec *attrSpec,string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  GLchar *name;
  string local_48;
  GLuint local_24;
  string *psStack_20;
  int attrLoc;
  string *shaderNameManglingSuffix_local;
  VarSpec *attrSpec_local;
  Program *this_local;
  
  GVar1 = this->m_programGL;
  psStack_20 = shaderNameManglingSuffix;
  shaderNameManglingSuffix_local = &attrSpec->name;
  attrSpec_local = (VarSpec *)this;
  mangleShaderNames(&local_48,&attrSpec->name,shaderNameManglingSuffix);
  name = (GLchar *)std::__cxx11::string::c_str();
  GVar1 = glwGetAttribLocation(GVar1,name);
  std::__cxx11::string::~string((string *)&local_48);
  local_24 = GVar1;
  glwDisableVertexAttribArray(GVar1);
  return;
}

Assistant:

void Program::disableAttributeArray (const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glDisableVertexAttribArray(attrLoc);
}